

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

natwm_error client_send_window_to_workspace(natwm_state *state,xcb_window_t window,size_t index)

{
  client *client_00;
  natwm_error err;
  client *client;
  size_t index_local;
  xcb_window_t window_local;
  natwm_state *state_local;
  
  client_00 = workspace_list_find_window_client(state->workspace_list,window);
  if (client_00 == (client *)0x0) {
    state_local._4_4_ = NO_ERROR;
  }
  else {
    state_local._4_4_ = workspace_list_send_to_workspace(state,client_00,index);
    if (state_local._4_4_ == NO_ERROR) {
      state_local._4_4_ = NO_ERROR;
    }
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error client_send_window_to_workspace(struct natwm_state *state, xcb_window_t window,
                                                 size_t index)
{
        struct client *client = workspace_list_find_window_client(state->workspace_list, window);

        if (!client) {
                return NO_ERROR;
        }

        enum natwm_error err = workspace_list_send_to_workspace(state, client, index);

        if (err != NO_ERROR) {
                return err;
        }

        return NO_ERROR;
}